

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::triangles_to_quads(GroupNode *this,float prop)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  size_t i;
  float in_stack_0000017c;
  Ref<embree::SceneGraph::Node> *in_stack_00000180;
  Node *local_68;
  long *local_60;
  ulong local_58;
  long **local_40;
  Node **local_30;
  reference local_20;
  Node **local_18;
  long **local_10;
  reference local_8;
  
  local_58 = 0;
  while( true ) {
    uVar1 = local_58;
    sVar2 = std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    *)(in_RDI + 0x68));
    if (sVar2 <= uVar1) break;
    local_20 = std::
               vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)(in_RDI + 0x68),local_58);
    local_18 = &local_68;
    local_68 = local_20->ptr;
    if (local_68 != (Node *)0x0) {
      (*(local_68->super_RefCount)._vptr_RefCount[2])();
    }
    convert_triangles_to_quads(in_stack_00000180,in_stack_0000017c);
    pvVar3 = std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                           *)(in_RDI + 0x68),local_58);
    local_10 = &local_60;
    local_8 = pvVar3;
    if (pvVar3->ptr != (Node *)0x0) {
      (*(pvVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pvVar3->ptr = (Node *)*local_10;
    *local_10 = (long *)0x0;
    local_40 = &local_60;
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 0x18))();
    }
    local_30 = &local_68;
    if (local_68 != (Node *)0x0) {
      (*(local_68->super_RefCount)._vptr_RefCount[3])();
    }
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void triangles_to_quads(float prop = inf)
      {
        for (size_t i=0; i<children.size(); i++)
          children[i] = convert_triangles_to_quads(children[i],prop);
      }